

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_engine.c
# Opt level: O3

HTS_Boolean HTS_Engine_load(HTS_Engine *engine,char **voices,size_t num_voices)

{
  HTS_ModelSet *ms;
  bool bVar1;
  HTS_Boolean HVar2;
  int iVar3;
  size_t num;
  size_t sVar4;
  double *pdVar5;
  char *pcVar6;
  char *pcVar7;
  double **ppdVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int iVar21;
  int iVar22;
  undefined1 auVar23 [16];
  int local_38;
  int iStack_34;
  long lVar18;
  
  HTS_Engine_clear(engine);
  ms = &engine->ms;
  HVar2 = HTS_ModelSet_load(ms,voices,num_voices);
  if (HVar2 == '\x01') {
    num = HTS_ModelSet_get_nstream(ms);
    sVar4 = HTS_ModelSet_get_sampling_frequency(ms);
    (engine->condition).sampling_frequency = sVar4;
    sVar4 = HTS_ModelSet_get_fperiod(ms);
    (engine->condition).fperiod = sVar4;
    pdVar5 = (double *)HTS_calloc(num,8);
    (engine->condition).msd_threshold = pdVar5;
    auVar15 = _DAT_00181100;
    if (num == 0) {
      pdVar5 = (double *)HTS_calloc(0,8);
      (engine->condition).gv_weight = pdVar5;
    }
    else {
      uVar10 = num + 1 & 0xfffffffffffffffe;
      lVar18 = num - 1;
      auVar23._8_4_ = (int)lVar18;
      auVar23._0_8_ = lVar18;
      auVar23._12_4_ = (int)((ulong)lVar18 >> 0x20);
      uVar9 = 0;
      auVar23 = auVar23 ^ _DAT_00181100;
      auVar12 = _DAT_001810f0;
      do {
        auVar20 = auVar12 ^ auVar15;
        iVar3 = auVar23._0_4_;
        iVar22 = auVar23._4_4_;
        if ((bool)(~(auVar20._4_4_ == iVar22 && iVar3 < auVar20._0_4_ || iVar22 < auVar20._4_4_) & 1
                  )) {
          pdVar5[uVar9] = 0.5;
        }
        if ((auVar20._12_4_ != auVar23._12_4_ || auVar20._8_4_ <= auVar23._8_4_) &&
            auVar20._12_4_ <= auVar23._12_4_) {
          pdVar5[uVar9 + 1] = 0.5;
        }
        uVar9 = uVar9 + 2;
        lVar18 = auVar12._8_8_;
        auVar12._0_8_ = auVar12._0_8_ + 2;
        auVar12._8_8_ = lVar18 + 2;
      } while (uVar10 != uVar9);
      pdVar5 = (double *)HTS_calloc(num,8);
      auVar15 = _DAT_00181100;
      (engine->condition).gv_weight = pdVar5;
      uVar9 = 0;
      auVar20 = _DAT_001810f0;
      do {
        bVar1 = iVar3 < SUB164(auVar20 ^ auVar15,0);
        iVar21 = SUB164(auVar20 ^ auVar15,4);
        if ((bool)(~(iVar22 < iVar21 || iVar21 == iVar22 && bVar1) & 1)) {
          pdVar5[uVar9] = 1.0;
        }
        if (iVar22 >= iVar21 && (iVar21 != iVar22 || !bVar1)) {
          pdVar5[uVar9 + 1] = 1.0;
        }
        uVar9 = uVar9 + 2;
        lVar18 = auVar20._8_8_;
        auVar20._0_8_ = auVar20._0_8_ + 2;
        auVar20._8_8_ = lVar18 + 2;
      } while (uVar10 != uVar9);
    }
    pcVar6 = HTS_ModelSet_get_option(ms,0);
    pcVar7 = strstr(pcVar6,"GAMMA=");
    if (pcVar7 != (char *)0x0) {
      iVar3 = atoi(pcVar7 + 6);
      (engine->condition).stage = (long)iVar3;
    }
    pcVar7 = strstr(pcVar6,"LN_GAIN=");
    if (pcVar7 != (char *)0x0) {
      iVar3 = atoi(pcVar7 + 8);
      (engine->condition).use_log_gain = iVar3 == 1;
    }
    pcVar6 = strstr(pcVar6,"ALPHA=");
    if (pcVar6 != (char *)0x0) {
      dVar11 = atof(pcVar6 + 6);
      (engine->condition).alpha = dVar11;
    }
    pdVar5 = (double *)HTS_calloc(num_voices,8);
    (engine->condition).duration_iw = pdVar5;
    auVar15 = _DAT_00181100;
    if (num_voices == 0) {
      ppdVar8 = (double **)HTS_calloc(0,8);
      (engine->condition).parameter_iw = ppdVar8;
      ppdVar8 = (double **)HTS_calloc(0,8);
      (engine->condition).gv_iw = ppdVar8;
    }
    else {
      auVar13._8_4_ = (int)(num_voices >> 0x20);
      auVar13._0_8_ = num_voices;
      auVar13._12_4_ = 0x45300000;
      dVar11 = 1.0 / ((auVar13._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)num_voices) - 4503599627370496.0));
      lVar18 = num_voices - 1;
      auVar14._8_4_ = (int)lVar18;
      auVar14._0_8_ = lVar18;
      auVar14._12_4_ = (int)((ulong)lVar18 >> 0x20);
      uVar9 = 0;
      auVar14 = auVar14 ^ _DAT_00181100;
      auVar19 = _DAT_001810f0;
      do {
        bVar1 = auVar14._0_4_ < SUB164(auVar19 ^ auVar15,0);
        iVar3 = auVar14._4_4_;
        iVar22 = SUB164(auVar19 ^ auVar15,4);
        if ((bool)(~(iVar3 < iVar22 || iVar22 == iVar3 && bVar1) & 1)) {
          pdVar5[uVar9] = dVar11;
        }
        if (iVar3 >= iVar22 && (iVar22 != iVar3 || !bVar1)) {
          pdVar5[uVar9 + 1] = dVar11;
        }
        uVar9 = uVar9 + 2;
        lVar18 = auVar19._8_8_;
        auVar19._0_8_ = auVar19._0_8_ + 2;
        auVar19._8_8_ = lVar18 + 2;
      } while ((num_voices + 1 & 0xfffffffffffffffe) != uVar9);
      ppdVar8 = (double **)HTS_calloc(num_voices,8);
      (engine->condition).parameter_iw = ppdVar8;
      uVar9 = num + 1 & 0xfffffffffffffffe;
      lVar18 = num - 1;
      auVar15._8_4_ = (int)lVar18;
      auVar15._0_8_ = lVar18;
      auVar15._12_4_ = (int)((ulong)lVar18 >> 0x20);
      sVar4 = 0;
      auVar15 = auVar15 ^ _DAT_00181100;
      do {
        pdVar5 = (double *)HTS_calloc(num,8);
        (engine->condition).parameter_iw[sVar4] = pdVar5;
        auVar12 = _DAT_00181100;
        local_38 = auVar15._0_4_;
        iStack_34 = auVar15._4_4_;
        if (num != 0) {
          pdVar5 = (engine->condition).parameter_iw[sVar4];
          uVar10 = 0;
          auVar16 = _DAT_001810f0;
          do {
            bVar1 = local_38 < SUB164(auVar16 ^ auVar12,0);
            iVar3 = SUB164(auVar16 ^ auVar12,4);
            if ((bool)(~(iStack_34 < iVar3 || iVar3 == iStack_34 && bVar1) & 1)) {
              pdVar5[uVar10] = dVar11;
            }
            if (iStack_34 >= iVar3 && (iVar3 != iStack_34 || !bVar1)) {
              pdVar5[uVar10 + 1] = dVar11;
            }
            uVar10 = uVar10 + 2;
            lVar18 = auVar16._8_8_;
            auVar16._0_8_ = auVar16._0_8_ + 2;
            auVar16._8_8_ = lVar18 + 2;
          } while (uVar9 != uVar10);
        }
        sVar4 = sVar4 + 1;
      } while (sVar4 != num_voices);
      ppdVar8 = (double **)HTS_calloc(num_voices,8);
      (engine->condition).gv_iw = ppdVar8;
      sVar4 = 0;
      do {
        pdVar5 = (double *)HTS_calloc(num,8);
        (engine->condition).gv_iw[sVar4] = pdVar5;
        auVar15 = _DAT_00181100;
        if (num != 0) {
          pdVar5 = (engine->condition).gv_iw[sVar4];
          uVar10 = 0;
          auVar17 = _DAT_001810f0;
          do {
            bVar1 = local_38 < SUB164(auVar17 ^ auVar15,0);
            iVar3 = SUB164(auVar17 ^ auVar15,4);
            if ((bool)(~(iStack_34 < iVar3 || iVar3 == iStack_34 && bVar1) & 1)) {
              pdVar5[uVar10] = dVar11;
            }
            if (iStack_34 >= iVar3 && (iVar3 != iStack_34 || !bVar1)) {
              pdVar5[uVar10 + 1] = dVar11;
            }
            uVar10 = uVar10 + 2;
            lVar18 = auVar17._8_8_;
            auVar17._0_8_ = auVar17._0_8_ + 2;
            auVar17._8_8_ = lVar18 + 2;
          } while (uVar9 != uVar10);
        }
        sVar4 = sVar4 + 1;
      } while (sVar4 != num_voices);
    }
    HVar2 = '\x01';
  }
  else {
    HTS_Engine_clear(engine);
    HVar2 = '\0';
  }
  return HVar2;
}

Assistant:

HTS_Boolean HTS_Engine_load(HTS_Engine * engine, char **voices, size_t num_voices)
{
   size_t i, j;
   size_t nstream;
   double average_weight;
   const char *option, *find;

   /* reset engine */
   HTS_Engine_clear(engine);

   /* load voices */
   if (HTS_ModelSet_load(&engine->ms, voices, num_voices) != TRUE) {
      HTS_Engine_clear(engine);
      return FALSE;
   }
   nstream = HTS_ModelSet_get_nstream(&engine->ms);
   average_weight = 1.0 / num_voices;

   /* global */
   engine->condition.sampling_frequency = HTS_ModelSet_get_sampling_frequency(&engine->ms);
   engine->condition.fperiod = HTS_ModelSet_get_fperiod(&engine->ms);
   engine->condition.msd_threshold = (double *) HTS_calloc(nstream, sizeof(double));
   for (i = 0; i < nstream; i++)
      engine->condition.msd_threshold[i] = 0.5;
   engine->condition.gv_weight = (double *) HTS_calloc(nstream, sizeof(double));
   for (i = 0; i < nstream; i++)
      engine->condition.gv_weight[i] = 1.0;

   /* spectrum */
   option = HTS_ModelSet_get_option(&engine->ms, 0);
   find = strstr(option, "GAMMA=");
   if (find != NULL)
      engine->condition.stage = (size_t) atoi(&find[strlen("GAMMA=")]);
   find = strstr(option, "LN_GAIN=");
   if (find != NULL)
      engine->condition.use_log_gain = atoi(&find[strlen("LN_GAIN=")]) == 1 ? TRUE : FALSE;
   find = strstr(option, "ALPHA=");
   if (find != NULL)
      engine->condition.alpha = atof(&find[strlen("ALPHA=")]);

   /* interpolation weights */
   engine->condition.duration_iw = (double *) HTS_calloc(num_voices, sizeof(double));
   for (i = 0; i < num_voices; i++)
      engine->condition.duration_iw[i] = average_weight;
   engine->condition.parameter_iw = (double **) HTS_calloc(num_voices, sizeof(double *));
   for (i = 0; i < num_voices; i++) {
      engine->condition.parameter_iw[i] = (double *) HTS_calloc(nstream, sizeof(double));
      for (j = 0; j < nstream; j++)
         engine->condition.parameter_iw[i][j] = average_weight;
   }
   engine->condition.gv_iw = (double **) HTS_calloc(num_voices, sizeof(double *));
   for (i = 0; i < num_voices; i++) {
      engine->condition.gv_iw[i] = (double *) HTS_calloc(nstream, sizeof(double));
      for (j = 0; j < nstream; j++)
         engine->condition.gv_iw[i][j] = average_weight;
   }

   return TRUE;
}